

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O1

char * __thiscall
despot::util::tinyxml::TiXmlComment::Parse
          (TiXmlComment *this,char *p,TiXmlParsingData *data,TiXmlEncoding encoding)

{
  TiXmlString *this_00;
  char cVar1;
  bool bVar2;
  TiXmlDocument *this_01;
  char *pcVar3;
  
  this_01 = TiXmlNode::GetDocument(&this->super_TiXmlNode);
  this_00 = &(this->super_TiXmlNode).value;
  TiXmlString::assign(this_00,"",0);
  pcVar3 = TiXmlBase::SkipWhiteSpace(p,encoding);
  if (data != (TiXmlParsingData *)0x0) {
    TiXmlParsingData::Stamp(data,pcVar3,encoding);
    (this->super_TiXmlNode).super_TiXmlBase.location = data->cursor;
  }
  bVar2 = TiXmlBase::StringEqual(pcVar3,"<!--",false,encoding);
  if (bVar2) {
    TiXmlString::assign(this_00,"",0);
    cVar1 = pcVar3[4];
    pcVar3 = pcVar3 + 4;
    while ((cVar1 != '\0' && (bVar2 = TiXmlBase::StringEqual(pcVar3,"-->",false,encoding), !bVar2)))
    {
      TiXmlString::append(this_00,pcVar3,1);
      cVar1 = pcVar3[1];
      pcVar3 = pcVar3 + 1;
    }
    pcVar3 = pcVar3 + 3;
  }
  else {
    TiXmlDocument::SetError(this_01,0xb,pcVar3,data,encoding);
    pcVar3 = (char *)0x0;
  }
  return pcVar3;
}

Assistant:

const char* TiXmlComment::Parse(const char* p, TiXmlParsingData* data,
	TiXmlEncoding encoding) {
	TiXmlDocument* document = GetDocument();
	value = "";

	p = SkipWhiteSpace(p, encoding);

	if (data) {
		data->Stamp(p, encoding);
		location = data->Cursor();
	}
	const char* startTag = "<!--";
	const char* endTag = "-->";

	if (!StringEqual(p, startTag, false, encoding)) {
		document->SetError(TIXML_ERROR_PARSING_COMMENT, p, data, encoding);
		return 0;
	}
	p += strlen(startTag);

	// [ 1475201 ] TinyXML parses entities in comments
	// Oops - ReadText doesn't work, because we don't want to parse the entities.
	// p = ReadText( p, &value, false, endTag, false, encoding );
	//
	// from the XML spec:
	/*
	 [Definition: Comments may appear anywhere in a document outside other markup; in addition,
	 they may appear within the document type declaration at places allowed by the grammar.
	 They are not part of the document's character data; an XML processor MAY, but need not,
	 make it possible for an application to retrieve the text of comments. For compatibility,
	 the string "--" (double-hyphen) MUST NOT occur within comments.] Parameter entity
	 references MUST NOT be recognized within comments.

	 An example of a comment:

	 <!-- declarations for <head> & <body> -->
	 */

	value = "";
	// Keep all the white space.
	while (p && *p && !StringEqual(p, endTag, false, encoding)) {
		value.append(p, 1);
		++p;
	}
	if (p)
		p += strlen(endTag);

	return p;
}